

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O0

void __thiscall
Lib::Stack<DP::SimpleCongruenceClosure::DistinctEntry>::expand
          (Stack<DP::SimpleCongruenceClosure::DistinctEntry> *this)

{
  DistinctEntry *pDVar1;
  void *pvVar2;
  DistinctEntry *in_RDI;
  size_t i;
  DistinctEntry *newStack;
  void *mem;
  size_t newCapacity;
  DistinctEntry *pDVar3;
  Literal *local_28;
  
  if (in_RDI->_lit == (Literal *)0x0) {
    pDVar1 = (DistinctEntry *)0x8;
  }
  else {
    pDVar1 = (DistinctEntry *)((long)in_RDI->_lit << 1);
  }
  pDVar3 = pDVar1;
  pvVar2 = Lib::alloc((size_t)in_RDI);
  if (in_RDI->_lit != (Literal *)0x0) {
    for (local_28 = (Literal *)0x0; local_28 < in_RDI->_lit;
        local_28 = (Literal *)((long)&(local_28->super_Term)._vptr_Term + 1)) {
      DP::SimpleCongruenceClosure::DistinctEntry::DistinctEntry(in_RDI,pDVar3);
      DP::SimpleCongruenceClosure::DistinctEntry::~DistinctEntry((DistinctEntry *)0x2a601a);
    }
    Lib::free((void *)(in_RDI->_consts)._capacity);
  }
  (in_RDI->_consts)._capacity = (size_t)pvVar2;
  (in_RDI->_consts)._stack = (uint *)((in_RDI->_consts)._capacity + (long)in_RDI->_lit * 0x28);
  (in_RDI->_consts)._cursor = (uint *)((in_RDI->_consts)._capacity + (long)pDVar1 * 0x28);
  in_RDI->_lit = (Literal *)pDVar1;
  return;
}

Assistant:

void expand ()
  {
    ASS(_cursor == _end);

    size_t newCapacity = _capacity ? (2 * _capacity) : 8;

    // allocate new stack and copy old stack's content to the new place
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(C),className());

    C* newStack = static_cast<C*>(mem);
    if(_capacity) {
      for (size_t i = 0; i<_capacity; i++) {
        ::new(newStack+i) C(std::move(_stack[i]));
        _stack[i].~C();
      }
      // deallocate the old stack
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }

    _stack = newStack;
    _cursor = _stack + _capacity;
    _end = _stack + newCapacity;
    _capacity = newCapacity;
  }